

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QLocalePrivate * findLocalePrivate(Language language,Script script,Territory territory)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QLocaleData *this;
  short in_DI;
  long in_FS_OFFSET;
  QLocaleData *data;
  qsizetype index;
  NumberOptions numberOptions;
  QLocaleId in_stack_0000005a;
  NumberOption in_stack_ffffffffffffffac;
  QSharedDataPointer<QLocalePrivate> *in_stack_ffffffffffffffb0;
  QFlagsStorage<QLocale::NumberOption> numberOptions_00;
  QLocaleData *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_DI == 1) {
    local_28 = (QLocaleData *)c_private();
  }
  else {
    qVar3 = QLocaleData::findLocaleIndex(in_stack_0000005a);
    this = locale_data + qVar3;
    QFlags<QLocale::NumberOption>::QFlags
              ((QFlags<QLocale::NumberOption> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
    numberOptions_00.i = (Int)((ulong)qVar3 >> 0x20);
    if (this->m_language_id == 1) {
      bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
              ::exists((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
                        *)0x14b122);
      if (bVar2) {
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>::
        operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
                    *)0x14b134);
        QSharedDataPointer<QLocalePrivate>::data(in_stack_ffffffffffffffb0);
      }
      this = defaultData();
      qVar3 = defaultIndex();
      numberOptions_00.i = (Int)((ulong)qVar3 >> 0x20);
    }
    local_28 = (QLocaleData *)operator_new(0x20);
    QLocalePrivate::QLocalePrivate
              ((QLocalePrivate *)this,local_28,(qsizetype)in_stack_ffffffffffffffb0,
               (NumberOptions)numberOptions_00.i,in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QLocalePrivate *)local_28;
}

Assistant:

static QLocalePrivate *findLocalePrivate(QLocale::Language language, QLocale::Script script,
                                         QLocale::Territory territory)
{
    if (language == QLocale::C)
        return c_private();

    qsizetype index = QLocaleData::findLocaleIndex(QLocaleId { language, script, territory });
    Q_ASSERT(index >= 0 && index < locale_data_size);
    const QLocaleData *data = locale_data + index;

    QLocale::NumberOptions numberOptions = QLocale::DefaultNumberOptions;

    // If not found, should use default locale:
    if (data->m_language_id == QLocale::C) {
        if (defaultLocalePrivate.exists())
            numberOptions = defaultLocalePrivate->data()->m_numberOptions;
        data = defaultData();
        index = defaultIndex();
    }
    return new QLocalePrivate(data, index, numberOptions);
}